

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

void monster_turn(monster_conflict *mon)

{
  short sVar1;
  monster_lore *pmVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int iVar5;
  uint32_t uVar6;
  errr eVar7;
  trap_kind_conflict *ptVar8;
  loc_conflict grid;
  monster *pmVar9;
  monster_conflict *pmVar10;
  monster_conflict *pmVar11;
  int iVar12;
  wchar_t wVar13;
  uint local_160;
  byte local_159;
  wchar_t amount;
  loc new;
  wchar_t d;
  char ghost_name [80];
  char bravado [80];
  wchar_t from_home;
  trap_kind *web_1;
  trap_kind *web;
  char m_name [80];
  _Bool local_2a;
  _Bool local_29;
  monster_stagger local_28;
  _Bool dead;
  int iStack_24;
  _Bool tracking;
  monster_stagger stagger;
  wchar_t dir;
  wchar_t i;
  _Bool did_something;
  monster_lore *lore;
  monster_conflict *mon_local;
  
  lore = (monster_lore *)mon;
  _i = get_lore(mon->race);
  dir._3_1_ = 0;
  iStack_24 = 0;
  local_29 = false;
  local_2a = false;
  monster_desc((char *)&web,0x50,(monster *)lore,L'̄');
  _Var3 = square_iswebbed((chunk *)cave,*(loc_conflict *)(lore->flags + 4));
  if (_Var3) {
    _Var3 = monster_is_visible((monster *)lore);
    if (_Var3) {
      flag_on_dbg(_i->flags,0xc,0x40,"lore->flags","RF_CLEAR_WEB");
      flag_on_dbg(_i->flags,0xc,0x41,"lore->flags","RF_PASS_WEB");
    }
    _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x41,"mon->race->flags","RF_PASS_WEB"
                        );
    if (!_Var3) {
      _Var3 = monster_is_visible((monster *)lore);
      if (_Var3) {
        flag_on_dbg(_i->flags,0xc,0x39,"lore->flags","RF_PASS_WALL");
        flag_on_dbg(_i->flags,0xc,0x3a,"lore->flags","RF_KILL_WALL");
      }
      _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x39,"mon->race->flags",
                           "RF_PASS_WALL");
      if (!_Var3) {
        _Var3 = monster_passes_walls((monster *)lore);
        if (!_Var3) {
          _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x40,"mon->race->flags",
                               "RF_CLEAR_WEB");
          if (!_Var3) {
            return;
          }
          ptVar8 = lookup_trap("web");
          if (ptVar8 != (trap_kind_conflict *)0x0) {
            square_remove_all_traps_of_type
                      ((chunk_conflict2 *)cave,*(loc_conflict *)(lore->flags + 4),ptVar8->tidx);
            return;
          }
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x696,"void monster_turn(struct monster *)");
        }
        ptVar8 = lookup_trap("web");
        if (ptVar8 == (trap_kind_conflict *)0x0) {
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x68f,"void monster_turn(struct monster *)");
        }
        square_remove_all_traps_of_type
                  ((chunk_conflict2 *)cave,*(loc_conflict *)(lore->flags + 4),ptVar8->tidx);
      }
    }
  }
  _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x25,"mon->race->flags",
                       "RF_TERRITORIAL");
  if ((_Var3) && (wVar4 = level_topography((int)player->place), wVar4 != L'\a')) {
    wVar4 = distance(*(loc *)((long)&lore[3].drops + 4),*(loc *)(lore->flags + 4));
    for (stagger = 5;
        (0 < (int)stagger &&
        (iVar5 = wVar4 * stagger, iVar12 = *(int *)(*(long *)lore + 0x3c) * 5,
        iVar5 == iVar12 || SBORROW4(iVar5,iVar12) != iVar5 + *(int *)(*(long *)lore + 0x3c) * -5 < 0
        )); stagger = stagger - CONFUSED_STAGGER) {
    }
    *(char *)((long)&lore->drops + 5) = *(char *)((long)&lore->drops + 5) + ('\x05' - (char)stagger)
    ;
    wVar4 = distance(*(loc *)((long)&lore[3].drops + 4),*(loc *)(lore[3].spell_flags + 0xc));
    wVar13 = *(int *)(*(long *)lore + 0x3c) * 5;
    if (wVar4 != wVar13 && SBORROW4(wVar4,wVar13) == wVar4 + *(int *)(*(long *)lore + 0x3c) * -5 < 0
       ) {
      *(undefined8 *)(lore[3].spell_flags + 0xc) = *(undefined8 *)((long)&lore[3].drops + 4);
    }
  }
  monster_group_rouse((chunk *)cave,(monster *)lore);
  _Var3 = monster_turn_multiply((monster_conflict *)lore);
  if (_Var3) {
    return;
  }
  uVar6 = Rand_div(0x10);
  if ((((uVar6 == 0) &&
       (_Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x27,"mon->race->flags",
                             "RF_SPEAKING"), _Var3)) &&
      (_Var3 = los(cave,*(loc *)(lore->flags + 4),player->grid), _Var3)) &&
     (*(short *)(lore->spell_flags + 10) == 0)) {
    _Var3 = monster_is_visible((monster *)lore);
    if (_Var3) {
      monster_desc((char *)&web,0x50,(monster *)lore,L'Ā');
    }
    else {
      strcpy((char *)&web,"It");
    }
    eVar7 = get_rnd_line("bravado.txt",ghost_name + 0x48);
    if (eVar7 == 0) {
      msg("%s %s",&web,ghost_name + 0x48);
    }
  }
  else {
    _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,2,"mon->race->flags",
                         "RF_PLAYER_GHOST");
    if (_Var3) {
      if (cave->ghost == (ghost_info *)0x0) {
        __assert_fail("cave->ghost",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x6cd,"void monster_turn(struct monster *)");
      }
      _Var3 = square_isview((chunk *)cave,*(loc_conflict *)(lore->flags + 4));
      if (((_Var3) && (cave->ghost->string_type == L'\x01')) &&
         (((cave->ghost->has_spoken & 1U) == 0 && (uVar6 = Rand_div(3), uVar6 == 0)))) {
        monster_desc((char *)&new.y,0x50,(monster *)lore,L'\x80');
        msg("%s says: \'%s\'",&new.y,cave->ghost->string);
        cave->ghost->has_spoken = true;
      }
    }
  }
  _Var3 = make_ranged_attack((monster *)lore);
  if (_Var3) {
    return;
  }
  local_28 = monster_turn_should_stagger((monster_conflict *)lore);
  if ((local_28 == NO_STAGGER) &&
     (_Var3 = get_move((monster_conflict *)lore,&stack0xffffffffffffffdc,&local_29), !_Var3)) {
    return;
  }
  stagger = NO_STAGGER;
  do {
    local_159 = 0;
    if ((int)stagger < 5) {
      local_159 = dir._3_1_ ^ 0xff;
    }
    if ((local_159 & 1) == 0) goto LAB_001aa941;
    if (local_28 == NO_STAGGER) {
      local_160 = (uint)side_dirs[iStack_24][(int)stagger];
    }
    else {
      uVar6 = Rand_div(8);
      local_160 = (uint)ddd[(int)uVar6];
    }
    new.x = local_160;
    grid = (loc_conflict)loc_sum(*(loc *)(lore->flags + 4),ddgrid[(int)local_160]);
    if ((((0 < (int)stagger) && (local_28 == NO_STAGGER)) &&
        (_Var3 = square_isview((chunk *)cave,*(loc_conflict *)(lore->flags + 4)), !_Var3)) &&
       ((local_29 & 1U) != 0)) goto LAB_001aa941;
    _Var3 = monster_turn_can_move
                      ((monster_conflict *)lore,(char *)&web,(loc)grid,local_28 == CONFUSED_STAGGER,
                       (_Bool *)((long)&dir + 3));
    if ((_Var3) &&
       ((_Var3 = square_iswarded((chunk *)cave,grid), !_Var3 ||
        (_Var3 = monster_turn_attack_glyph((monster_conflict *)lore,(loc)grid), _Var3)))) {
      _Var3 = square_isdecoyed((chunk *)cave,grid);
      if (_Var3) {
        _Var3 = monster_is_visible((monster *)lore);
        if (_Var3) {
          flag_on_dbg(_i->flags,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
        }
        _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x1a,"mon->race->flags",
                             "RF_NEVER_BLOW");
        if (!_Var3) {
          square_destroy_decoy((chunk *)cave,grid);
          dir._3_1_ = 1;
LAB_001aa941:
          if ((dir._3_1_ & 1) != 0) {
            _Var3 = monster_is_visible((monster *)lore);
            if (_Var3) {
              flag_on_dbg(_i->flags,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
            }
            _Var3 = monster_is_visible((monster *)lore);
            if (((_Var3) && (_Var3 = monster_is_in_view((monster *)lore), _Var3)) &&
               (((player->opts).opt[10] & 1U) != 0)) {
              disturb(player);
            }
          }
          if (((dir._3_1_ & 1) == 0) && (*(short *)(lore->spell_flags + 10) != 0)) {
            sVar1 = *(short *)(lore->spell_flags + 10);
            mon_clear_timed((monster *)lore,L'\x03',L'\x04');
            mon_inc_timed((monster *)lore,L'\x06',(int)sVar1,L'\x01');
          }
          if (((dir._3_1_ & 1) != 0) && (_Var3 = monster_is_camouflaged((monster *)lore), _Var3)) {
            become_aware((chunk *)cave,(monster *)lore);
          }
          return;
        }
      }
      else {
        _Var3 = square_isplayer((chunk *)cave,grid);
        if (_Var3) {
          if (*(int *)&lore[3].drops == -1) {
            _Var3 = monster_is_visible((monster *)lore);
            if (_Var3) {
              flag_on_dbg(_i->flags,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
            }
            _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x1a,"mon->race->flags",
                                 "RF_NEVER_BLOW");
            if (_Var3) goto LAB_001aa933;
            make_attack_normal((monster *)lore,player);
            dir._3_1_ = 1;
            goto LAB_001aa941;
          }
        }
        else {
          _Var3 = flag_has_dbg((bitflag *)(*(long *)lore + 0x5c),0xc,0x1b,"mon->race->flags",
                               "RF_NEVER_MOVE");
          if (_Var3) {
            _Var3 = monster_is_visible((monster *)lore);
            if (!_Var3) {
              return;
            }
            flag_on_dbg(_i->flags,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
            return;
          }
        }
        pmVar9 = square_monster((chunk *)cave,grid);
        if (pmVar9 == (monster *)0x0) {
          monster_swap(*(loc_conflict *)(lore->flags + 4),grid);
          _Var3 = square_ismonstertrap((chunk *)cave,grid);
          if (_Var3) {
            monster_hit_trap((monster *)lore,grid,&local_2a);
          }
          dir._3_1_ = 1;
        }
        else {
          pmVar10 = (monster_conflict *)square_monster((chunk *)cave,grid);
          pmVar11 = cave_monster(cave,*(wchar_t *)&lore[3].drops);
          pmVar2 = lore;
          if (pmVar10 == pmVar11) {
            pmVar10 = cave_monster(cave,*(wchar_t *)&lore[3].drops);
            monster_attack_monster((monster *)pmVar2,(monster *)pmVar10);
          }
          else {
            dir._3_1_ = monster_turn_try_push
                                  ((monster_conflict *)lore,(char *)&web,(loc)grid,&local_2a);
          }
        }
        pmVar2 = lore;
        if ((local_2a & 1U) != 0) {
          return;
        }
        pmVar9 = square_monster((chunk *)cave,grid);
        if ((monster *)pmVar2 == pmVar9) {
          monster_turn_grab_objects((monster_conflict *)lore,(char *)&web,(loc)grid);
        }
      }
    }
LAB_001aa933:
    stagger = stagger + CONFUSED_STAGGER;
  } while( true );
}

Assistant:

static void monster_turn(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	bool did_something = false;

	int i;
	int dir = 0;
	enum monster_stagger stagger;
	bool tracking = false;
	bool dead = false;
	char m_name[80];

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, mon->grid)) {
		/* Learn web behaviour */
		if (monster_is_visible(mon)) {
			rf_on(lore->flags, RF_CLEAR_WEB);
			rf_on(lore->flags, RF_PASS_WEB);
		}

		/* If we can pass, no need to clear */
		if (!rf_has(mon->race->flags, RF_PASS_WEB)) {
			/* Learn wall behaviour */
			if (monster_is_visible(mon)) {
				rf_on(lore->flags, RF_PASS_WALL);
				rf_on(lore->flags, RF_KILL_WALL);
			}

			/* Now several possibilities */
			if (rf_has(mon->race->flags, RF_PASS_WALL)) {
				/* Insubstantial monsters go right through */
			} else if (monster_passes_walls(mon)) {
				/* If you can destroy a wall, you can destroy a web */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
			} else if (rf_has(mon->race->flags, RF_CLEAR_WEB)) {
				/* Clearing costs a turn (assume there are no other "traps") */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
				return;
			} else {
				/* Stuck */
				return;
			}
		}
	}

	/* Handle territorial monsters */
	if (rf_has(mon->race->flags, RF_TERRITORIAL) &&
		(level_topography(player->place) != TOP_CAVE)) {
		/* Territorial monsters get a direct energy boost when close to home */
		int from_home =	distance(mon->home, mon->grid);

		/* Step up in units of a fifth of monster detection range */
		for (i = 5; i > 0; i--) {
			if ((from_home * i) > (mon->race->hearing * 5))
				break;
		}

		/* Add some energy */
		mon->energy += (5 - i);

		/* If target is too far away from home, go back */
		if (distance(mon->home, mon->target.grid) >	5 * mon->race->hearing) {
			mon->target.grid = mon->home;
		}
	}

	/* Let other group monsters know about the player */
	monster_group_rouse(cave, mon);

	/* Try to multiply - this can use up a turn */
	if (monster_turn_multiply(mon))
		return;

	/* Monsters can speak.  -originally by TY- */
	if (one_in_(16) && rf_has(mon->race->flags, RF_SPEAKING) &&
		los(cave, mon->grid, player->grid) && !mon->m_timed[MON_TMD_FEAR]) {
		char bravado[80];

		/* Acquire the monster name/poss */
		if (monster_is_visible(mon)) {
			monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL);
		} else {
			strcpy(m_name, "It");
		}

		if (!get_rnd_line("bravado.txt", bravado)) {
			msg("%s %s", m_name, bravado);
		}
	} else if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		assert(cave->ghost);
		if (square_isview(cave, mon->grid) && (cave->ghost->string_type == 1)
			&& !cave->ghost->has_spoken && one_in_(3)) {
			/* Player ghosts may have a unique message they can say. */
			char ghost_name[80];

			/* Acquire the monster name/poss.  The player ghost will 
			 * always be identified, to heighten the effect.*/
			monster_desc(ghost_name, sizeof(ghost_name), mon, MDESC_SHOW);

			msg("%s says: '%s'", ghost_name, cave->ghost->string);
			cave->ghost->has_spoken = true;
		}
	}

	/* Attempt a ranged attack */
	if (make_ranged_attack(mon)) return;

	/* Work out what kind of movement to use - random movement or AI */
	stagger = monster_turn_should_stagger(mon);
	if (stagger == NO_STAGGER) {
		/* If there's no sensible move, we're done */
		if (!get_move(mon, &dir, &tracking)) return;
	}

	/* Try to move first in the chosen direction, or next either side of the
	 * chosen direction, or next at right angles to the chosen direction.
	 * Monsters which are tracking by sound or scent will not move if they
	 * can't move in their chosen direction. */
	for (i = 0; i < 5 && !did_something; i++) {
		/* Get the direction (or stagger) */
		int d = (stagger != NO_STAGGER) ? ddd[randint0(8)] : side_dirs[dir][i];

		/* Get the grid to step to or attack */
		struct loc new = loc_sum(mon->grid, ddgrid[d]);

		/* Tracking monsters have their best direction, don't change */
		if ((i > 0) && stagger == NO_STAGGER &&
			!square_isview(cave, mon->grid) && tracking) {
			break;
		}

		/* Check if we can move */
		if (!monster_turn_can_move(mon, m_name, new,
								   stagger == CONFUSED_STAGGER, &did_something))
			continue;

		/* Try to break the glyph if there is one.  This can happen multiple
		 * times per turn because failure does not break the loop */
		if (square_iswarded(cave, new) && !monster_turn_attack_glyph(mon, new))
			continue;

		/* Break a decoy if there is one */
		if (square_isdecoyed(cave, new)) {
			/* Learn about if the monster attacks */
			if (monster_is_visible(mon))
				rf_on(lore->flags, RF_NEVER_BLOW);

			/* Some monsters never attack */
			if (rf_has(mon->race->flags, RF_NEVER_BLOW))
				continue;

			/* Wait a minute... */
			square_destroy_decoy(cave, new);
			did_something = true;
			break;
		}

		/* The player is in the way. */
		if (square_isplayer(cave, new)) {
			if (mon->target.midx == -1) {
				/* Learn about if the monster attacks */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_BLOW);

				/* Some monsters never attack */
				if (rf_has(mon->race->flags, RF_NEVER_BLOW))
					continue;

				/* Otherwise, attack the player */
				make_attack_normal(mon, player);

				did_something = true;
				break;
			} else {
				/* Don't want to attack, so look for other options */
			}
		} else {
			/* Some monsters never move */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				/* Learn about lack of movement */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_MOVE);

				return;
			}
		}

		/* A monster is in the way, try to push past/kill */
		if (square_monster(cave, new)) {
			if (square_monster(cave, new) == cave_monster(cave,
														  mon->target.midx)) {
				monster_attack_monster(mon,
									   cave_monster(cave, mon->target.midx));
			} else {
				did_something = monster_turn_try_push(mon, m_name, new, &dead);
			}
		} else {
			/* Otherwise we can just move */
			monster_swap(mon->grid, new);

			/* Check for monster traps */
			if (square_ismonstertrap(cave, new)) {
				monster_hit_trap(mon, new, &dead);
			}
			did_something = true;
		}

		/* Monster may have died */
		if (dead) return;

		/* Scan all objects in the grid, if we reached it */
		if (mon == square_monster(cave, new)) {
			monster_turn_grab_objects(mon, m_name, new);
		}
	}

	if (did_something) {
		/* Learn about no lack of movement */
		if (monster_is_visible(mon))
			rf_on(lore->flags, RF_NEVER_MOVE);

		/* Possible disturb */
		if (monster_is_visible(mon) && monster_is_in_view(mon) && 
			OPT(player, disturb_near))
			disturb(player);		
	}

	/* Out of options - monster is paralyzed by fear (unless attacked) */
	if (!did_something && mon->m_timed[MON_TMD_FEAR]) {
		int amount = mon->m_timed[MON_TMD_FEAR];
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		mon_inc_timed(mon, MON_TMD_HOLD, amount, MON_TMD_FLG_NOTIFY);
	}

	/* If we see an unaware monster do something, become aware of it */
	if (did_something && monster_is_camouflaged(mon))
		become_aware(cave, mon);
}